

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O2

void progress_monitor(j_common_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  
  if ((cinfo->is_decompressor != 0) &&
     ((anonymous_namespace)::scan_limit < *(int *)((long)&cinfo[4].mem + 4))) {
    pjVar1 = cinfo->err;
    std::__cxx11::string::operator=
              ((string *)&pjVar1[2].reset_error_mgr,
               "Pl_DCT::decompress: JPEG data has too many scans");
    longjmp((__jmp_buf_tag *)(pjVar1 + 1),1);
  }
  return;
}

Assistant:

static void
progress_monitor(j_common_ptr cinfo)
{
    if (cinfo->is_decompressor &&
        reinterpret_cast<jpeg_decompress_struct*>(cinfo)->input_scan_number > scan_limit) {
        auto* jerr = reinterpret_cast<qpdf_jpeg_error_mgr*>(cinfo->err);
        jerr->msg = "Pl_DCT::decompress: JPEG data has too many scans";
        longjmp(jerr->jmpbuf, 1);
    }
}